

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall defyx::JitCompilerX86::generateCode(JitCompilerX86 *this,Instruction *instr,int i)

{
  code *UNRECOVERED_JUMPTABLE;
  long lVar1;
  long *plVar2;
  
  std::vector<int,_std::allocator<int>_>::push_back(&this->instructionOffsets,&this->codePos);
  lVar1 = (ulong)instr->opcode * 0x10;
  UNRECOVERED_JUMPTABLE = *(code **)(engine + lVar1);
  plVar2 = (long *)((long)this->registerUsage + *(long *)(engine + lVar1 + 8) + -0x18);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar2 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar2,instr,i);
  return;
}

Assistant:

void JitCompilerX86::generateCode(Instruction& instr, int i) {
		instructionOffsets.push_back(codePos);
		auto generator = engine[instr.opcode];
		(this->*generator)(instr, i);
	}